

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getReducedRow
          (Highs *this,HighsInt row,double *row_vector,HighsInt *row_num_nz,HighsInt *row_indices,
          double *pass_basis_inverse_row_vector)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  double *in_R9;
  undefined1 unaff_retaddr;
  HighsInt *in_stack_00000008;
  HighsInt *in_stack_00000010;
  double *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  HighsInt row_1;
  HighsInt el;
  double value;
  HighsInt col;
  bool return_indices;
  vector<int,_std::allocator<int>_> col_indices;
  vector<double,_std::allocator<double>_> rhs;
  double *basis_inverse_row_vector;
  vector<double,_std::allocator<double>_> basis_inverse_row;
  HighsInt num_row;
  HighsLp *lp;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  Highs *this_01;
  undefined4 in_stack_ffffffffffffff10;
  value_type vVar4;
  undefined4 in_stack_ffffffffffffff14;
  int iVar5;
  size_type in_stack_ffffffffffffff18;
  double dVar6;
  undefined4 in_stack_ffffffffffffff20;
  int iVar7;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar8;
  vector<double,_std::allocator<double>_> local_b0;
  double *local_98;
  int local_78;
  undefined1 local_61 [33];
  int *local_40;
  double *local_38;
  long local_30;
  int *local_28;
  long local_20;
  uint local_14;
  HighsStatus local_4;
  
  local_40 = (int *)(in_RDI + 0x138);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  HighsLp::ensureColwise((HighsLp *)0x49001e);
  if (local_20 == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"getReducedRow: row_vector is NULL\n");
    local_4 = kError;
  }
  else if (((int)local_14 < 0) || (local_40[1] <= (int)local_14)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Row index %d out of range [0, %d] in getReducedRow\n",(ulong)local_14,
                 (ulong)(local_40[1] - 1));
    local_4 = kError;
  }
  else if ((*(byte *)(in_RDI + 0x3850) & 1) == 0) {
    this_01 = (Highs *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_61 + 1),"getReducedRow",(allocator *)this_01);
    local_4 = invertRequirementError
                        (this_01,(string *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::__cxx11::string::~string((string *)(local_61 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_61);
  }
  else {
    local_78 = local_40[1];
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4901b3);
    local_98 = local_38;
    if (local_38 == (double *)0x0) {
      this_00 = &local_b0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x4901e1);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4901eb);
      std::vector<double,_std::allocator<double>_>::assign
                (this_00,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (value_type_conflict1 *)0x49020b);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_b0,(long)(int)local_14);
      *pvVar2 = 1.0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x49025e);
      basisSolveInterface(_row_1,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                          in_stack_00000008,(bool)unaff_retaddr);
      local_98 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x49028d);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff00);
    }
    uVar8 = (uint)(local_28 != (int *)0x0) << 0x18;
    if (local_28 != (int *)0x0) {
      *local_28 = 0;
    }
    for (iVar7 = 0; iVar7 < *local_40; iVar7 = iVar7 + 1) {
      dVar6 = 0.0;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_40 + 0x24),(long)iVar7);
      iVar1 = *pvVar3;
      while( true ) {
        iVar5 = iVar1;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_40 + 0x24),(long)(iVar7 + 1)
                           );
        if (*pvVar3 <= iVar1) break;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_40 + 0x30),(long)iVar5);
        vVar4 = *pvVar3;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_40 + 0x36),(long)iVar5
                           );
        dVar6 = *pvVar2 * local_98[vVar4] + dVar6;
        iVar1 = iVar5 + 1;
      }
      *(undefined8 *)(local_20 + (long)iVar7 * 8) = 0;
      if (1e-14 < ABS(dVar6)) {
        if ((uVar8 & 0x1000000) != 0) {
          iVar1 = *local_28;
          *local_28 = iVar1 + 1;
          *(int *)(local_30 + (long)iVar1 * 4) = iVar7;
        }
        *(double *)(local_20 + (long)iVar7 * 8) = dVar6;
      }
    }
    local_4 = kOk;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff00);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getReducedRow(const HighsInt row, double* row_vector,
                                 HighsInt* row_num_nz, HighsInt* row_indices,
                                 const double* pass_basis_inverse_row_vector) {
  HighsLp& lp = model_.lp_;
  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (row_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getReducedRow: row_vector is NULL\n");
    return HighsStatus::kError;
  }
  // row_indices can be NULL - it's the trigger that determines
  // whether they are identified or not pass_basis_inverse_row_vector
  // NULL - it's the trigger to determine whether it's computed or not
  if (row < 0 || row >= lp.num_row_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT "] in getReducedRow\n",
                 row, lp.num_row_ - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getReducedRow");
  HighsInt num_row = lp.num_row_;
  vector<double> basis_inverse_row;
  double* basis_inverse_row_vector = (double*)pass_basis_inverse_row_vector;
  if (basis_inverse_row_vector == NULL) {
    vector<double> rhs;
    vector<HighsInt> col_indices;
    rhs.assign(num_row, 0);
    rhs[row] = 1;
    basis_inverse_row.resize(num_row, 0);
    // Form B^{-T}e_{row}
    basisSolveInterface(rhs, basis_inverse_row.data(), NULL, NULL, true);
    basis_inverse_row_vector = basis_inverse_row.data();
  }
  bool return_indices = row_num_nz != NULL;
  if (return_indices) *row_num_nz = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = 0;
    for (HighsInt el = lp.a_matrix_.start_[col];
         el < lp.a_matrix_.start_[col + 1]; el++) {
      HighsInt row = lp.a_matrix_.index_[el];
      value += lp.a_matrix_.value_[el] * basis_inverse_row_vector[row];
    }
    row_vector[col] = 0;
    if (fabs(value) > kHighsTiny) {
      if (return_indices) row_indices[(*row_num_nz)++] = col;
      row_vector[col] = value;
    }
  }
  return HighsStatus::kOk;
}